

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicHeap.hpp
# Opt level: O2

bool __thiscall
Lib::
DynamicHeap<unsigned_int,_DP::SimpleCongruenceClosure::ConstOrderingComparator,_Lib::ArrayMap<unsigned_int>,_unsigned_int>
::isGreater1(DynamicHeap<unsigned_int,_DP::SimpleCongruenceClosure::ConstOrderingComparator,_Lib::ArrayMap<unsigned_int>,_unsigned_int>
             *this,size_t idxA,size_t idxB)

{
  uint *puVar1;
  Comparison CVar2;
  
  puVar1 = (this->_heap)._array;
  CVar2 = DP::SimpleCongruenceClosure::ConstOrderingComparator::compare
                    (&this->_cmp,puVar1[idxA - 1],puVar1[idxB - 1]);
  return CVar2 == GREATER;
}

Assistant:

bool isGreater1(size_t idxA, size_t idxB)
  {
    ASS_G(idxA, 0);
    ASS_LE(idxA, size());
    ASS_G(idxB, 0);
    ASS_LE(idxB, size());

    T* data1 = getData1();
    return _cmp.compare(data1[idxA], data1[idxB])==GREATER;
  }